

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::InternalSwap
          (RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType> *this,
          RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType> *other)

{
  RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType> *other_local;
  RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }